

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DList.h
# Opt level: O0

PageSegmentBase<Memory::PreReservedVirtualAllocWrapper> * __thiscall
DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,RealCount>::
PrependNode<Memory::NoThrowHeapAllocator,Memory::PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>>*,bool,bool,bool>
          (DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,RealCount>
           *this,NoThrowHeapAllocator *allocator,
          PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
          *param1,bool param2,bool param3,bool param4)

{
  NoThrowHeapAllocator *alloc;
  NodeBase *this_00;
  DListNodeBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_> **ppDVar1;
  TrackAllocData local_60;
  NodeBase *local_38;
  Node *newNode;
  bool param4_local;
  bool param3_local;
  PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
  *pPStack_28;
  bool param2_local;
  PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
  *param1_local;
  NoThrowHeapAllocator *allocator_local;
  DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount> *this_local;
  
  newNode._5_1_ = param4;
  newNode._6_1_ = param3;
  newNode._7_1_ = param2;
  pPStack_28 = param1;
  param1_local = (PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
                  *)allocator;
  allocator_local = (NoThrowHeapAllocator *)this;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_60,
             (type_info *)
             &DListNode<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>>::typeinfo,0
             ,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
             ,0x13e);
  alloc = Memory::NoThrowHeapAllocator::TrackAllocInfo(allocator,&local_60);
  this_00 = (NodeBase *)new<Memory::NoThrowHeapAllocator>(0x98,alloc,0x8f5de0);
  DListNode<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>>::
  DListNode<Memory::PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>>*,bool,bool,bool>
            ((DListNode<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>> *)this_00,
             pPStack_28,(bool)(newNode._7_1_ & 1),(bool)(newNode._6_1_ & 1),
             (bool)(newNode._5_1_ & 1));
  if (this_00 == (NodeBase *)0x0) {
    this_local = (DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>
                  *)0x0;
  }
  else {
    local_38 = this_00;
    ppDVar1 = DListNodeBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>::Next
                        ((DListNodeBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
                          *)this);
    DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>::
    InsertNodeBefore(*ppDVar1,local_38);
    RealCount::IncrementCount((RealCount *)(this + 0x10));
    this_local = (DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>
                  *)(local_38 + 1);
  }
  return (PageSegmentBase<Memory::PreReservedVirtualAllocWrapper> *)this_local;
}

Assistant:

TData * PrependNode(TAllocator * allocator, TParam1 param1, TParam2 param2, TParam3 param3, TParam4 param4)
    {
        Node * newNode = AllocatorNew(TAllocator, allocator, Node, param1, param2, param3, param4);
        if (newNode)
        {
            DListBase::InsertNodeBefore(this->Next(), newNode);
            this->IncrementCount();
            return &newNode->data;
        }
        return nullptr;
    }